

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O2

Matrix3f * operator*(Matrix3f *__return_storage_ptr__,Matrix3f *x,Matrix3f *y)

{
  float fVar1;
  undefined1 auVar2 [16];
  int i;
  long lVar3;
  float *pfVar4;
  float *pfVar5;
  long lVar6;
  long lVar7;
  
  Matrix3f::Matrix3f(__return_storage_ptr__,0.0);
  lVar3 = 0;
  pfVar4 = __return_storage_ptr__->m_elements;
  for (; lVar3 != 3; lVar3 = lVar3 + 1) {
    lVar6 = 0;
    pfVar5 = y->m_elements;
    for (; lVar6 != 3; lVar6 = lVar6 + 1) {
      fVar1 = x->m_elements[lVar6 * 3 + lVar3];
      for (lVar7 = 0; lVar7 != 0x24; lVar7 = lVar7 + 0xc) {
        auVar2 = vfmadd213ss_fma(ZEXT416(*(uint *)((long)pfVar5 + lVar7)),ZEXT416((uint)fVar1),
                                 ZEXT416(*(uint *)((long)pfVar4 + lVar7)));
        *(int *)((long)pfVar4 + lVar7) = auVar2._0_4_;
      }
      pfVar5 = pfVar5 + 1;
    }
    pfVar4 = pfVar4 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix3f operator * ( const Matrix3f& x, const Matrix3f& y )
{
	Matrix3f product; // zeroes

	for( int i = 0; i < 3; ++i )
	{
		for( int j = 0; j < 3; ++j )
		{
			for( int k = 0; k < 3; ++k )
			{
				product( i, k ) += x( i, j ) * y( j, k );
			}
		}
	}

	return product;
}